

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmemcache_test_utilization.c
# Opt level: O1

int main(int argc,char **argv)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char *__nptr;
  char *__nptr_00;
  size_t sVar5;
  size_t sVar6;
  int iVar7;
  uint uVar8;
  time_t tVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int *piVar13;
  ulonglong uVar14;
  ulong uVar15;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  size_t *prog;
  char **ppcVar16;
  size_t *psVar17;
  char *__s;
  uint *puVar18;
  float fVar19;
  char *pcStack_1138;
  size_t *psStack_1130;
  char **ppcStack_1128;
  int *piStack_1120;
  size_t *psStack_1118;
  char *pcStack_1110;
  code *pcStack_1108;
  char *pcStack_1100;
  char **ppcStack_10f8;
  ulong uStack_10f0;
  char *pcStack_10e8;
  size_t *psStack_10e0;
  ulong uStack_10d8;
  code *apcStack_10d0 [2];
  unsigned_long_long local_10c0;
  test_params p;
  char key [30];
  ulong local_70;
  unsigned_long_long used_size;
  ulong local_60;
  float local_54;
  void *local_50;
  ulong local_48;
  ulong local_40;
  char local_31;
  on_evict_info info;
  
  local_40 = 0;
  apcStack_10d0[0] = (code *)0x101514;
  memset(&local_10c0,0,0x1028);
  local_10c0 = 0x100000;
  p.pool_size = 0x100;
  p.seconds._4_4_ = 1;
  local_50 = (void *)0x46;
  puVar18 = &switchD_00101571::switchdataD_00102010;
  uVar15 = 0;
  local_48 = 0;
LAB_00101550:
  apcStack_10d0[0] = (code *)0x10155e;
  iVar7 = getopt(argc,argv,"hp:e:v:t:m:o:d:s:n");
  switch(iVar7) {
  case 100:
    if (*_optarg != '\0') {
      apcStack_10d0[0] = (code *)0x101592;
      strcpy((char *)&p.val_max,_optarg);
      goto LAB_00101550;
    }
    apcStack_10d0[0] = (code *)0x101a70;
    argerror("invalid dir argument\n",*argv);
LAB_00101a70:
    apcStack_10d0[0] = (code *)0x101a7f;
    argerror("missing required dir argument\n",*argv);
LAB_00101a7f:
    prog = (size_t *)*argv;
    apcStack_10d0[0] = (code *)0x101a8e;
    argerror("timeout must be greater than 0\n",(char *)prog);
    break;
  case 0x65:
    apcStack_10d0[0] = (code *)0x1015e8;
    p.pool_size = parse_ull("extent size",*argv);
    goto LAB_00101550;
  case 0x66:
  case 0x67:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x71:
  case 0x72:
  case 0x75:
switchD_00101571_caseD_66:
    apcStack_10d0[0] = (code *)0x101a49;
    argerror("",*argv);
switchD_00101571_caseD_68:
    apcStack_10d0[0] = (code *)0x101a5a;
    printf("usage: %s -d <dir> [-p <pool_size>] [-e <extent_size>] [-v <val_max_factor>] [-t <timeout_seconds>] [-m <timeout_minutes>] [-o <timeout_hours>] [-s <seed_for_rand>] [-n] [-h]\n\t n  -  do not print out csv output (it is printed by default)\n"
           ,*argv);
    apcStack_10d0[0] = (code *)0x101a61;
    exit(0);
  case 0x68:
    goto switchD_00101571_caseD_68;
  case 0x6d:
    apcStack_10d0[0] = (code *)0x1015ba;
    uVar8 = parse_unsigned("minutes",*argv);
    uVar15 = (ulong)uVar8;
    goto LAB_00101550;
  case 0x6e:
    p.seconds._4_4_ = 0;
    goto LAB_00101550;
  case 0x6f:
    apcStack_10d0[0] = (code *)0x1015ce;
    uVar8 = parse_unsigned("hours",*argv);
    local_48 = (ulong)uVar8;
    goto LAB_00101550;
  case 0x70:
    apcStack_10d0[0] = (code *)0x10161d;
    local_10c0 = parse_ull("pool size",*argv);
    goto LAB_00101550;
  case 0x73:
    apcStack_10d0[0] = (code *)0x1015a3;
    p.seconds._0_4_ = parse_unsigned("seed for rand()",*argv);
    goto LAB_00101550;
  case 0x74:
    apcStack_10d0[0] = (code *)0x101603;
    uVar8 = parse_unsigned("seconds",*argv);
    local_40 = (ulong)uVar8;
    goto LAB_00101550;
  case 0x76:
    goto switchD_00101571_caseD_76;
  default:
    if (iVar7 != -1) goto switchD_00101571_caseD_66;
    if ((char)p.val_max == '\0') goto LAB_00101a70;
    p.dir._4088_8_ = local_48 * 0xe10 + uVar15 * 0x3c + local_40;
    if (p.dir._4088_8_ == 0) goto LAB_00101a7f;
    p.extent_size = (long)local_50 * p.pool_size;
    puVar18 = (uint *)&p.val_max;
    if ((uint)p.seconds == 0) {
      apcStack_10d0[0] = (code *)0x1016b0;
      tVar9 = time((time_t *)0x0);
      p.seconds._0_4_ = (uint)tVar9;
    }
    apcStack_10d0[0] = (code *)0x1016c1;
    srand((uint)p.seconds);
    apcStack_10d0[0] = (code *)0x1016d5;
    printf("seed = %u\n",(ulong)(uint)p.seconds);
    apcStack_10d0[0] = (code *)0x1016da;
    argv = (char **)vmemcache_new();
    apcStack_10d0[0] = (code *)0x1016ec;
    vmemcache_set_size(argv,local_10c0);
    apcStack_10d0[0] = (code *)0x1016fb;
    vmemcache_set_extent_size(argv,p.pool_size);
    apcStack_10d0[0] = (code *)0x101708;
    vmemcache_set_eviction_policy(argv,1);
    apcStack_10d0[0] = (code *)0x101713;
    prog = (size_t *)puVar18;
    iVar7 = vmemcache_add(argv);
    if (iVar7 == 0) {
      local_31 = '\0';
      apcStack_10d0[0] = (code *)0x101731;
      vmemcache_callback_on_evict(argv,on_evict);
      if (p.seconds._4_4_ != 0) {
        apcStack_10d0[0] = (code *)0x101746;
        puts("keynum,ratio");
      }
      sVar5 = p.extent_size;
      apcStack_10d0[0] = (code *)0x101755;
      local_50 = malloc(p.extent_size);
      if (local_50 == (void *)0x0) {
        apcStack_10d0[0] = (code *)0x1019eb;
        fprintf(_stderr,"malloc: cannot allocate memory (%zu bytes)\n",sVar5);
        iVar7 = 1;
        goto LAB_00101a1d;
      }
      local_60 = 0;
      apcStack_10d0[0] = (code *)0x101771;
      tVar9 = time((time_t *)0x0);
      used_size = tVar9 + p.dir._4088_8_;
      fVar19 = 0.0;
      uVar15 = 0;
      goto LAB_00101789;
    }
  }
  apcStack_10d0[0] = parse_ull;
  psVar17 = (size_t *)puVar18;
  main_cold_1();
  __nptr = _optarg;
  pcStack_10e8 = "hp:e:v:t:m:o:d:s:n";
  pcStack_1100 = (char *)0x0;
  pcStack_1108 = (code *)0x101ac5;
  ppcStack_10f8 = argv;
  uStack_10f0 = (ulong)(uint)argc;
  psStack_10e0 = (size_t *)puVar18;
  uStack_10d8 = uVar15;
  apcStack_10d0[0] = (code *)&stack0xfffffffffffffff8;
  piVar13 = __errno_location();
  *piVar13 = 0;
  pcStack_1108 = (code *)0x101ade;
  uVar14 = strtoull(__nptr,&pcStack_1100,10);
  if ((((*piVar13 != 0x22 || uVar14 != 0xffffffffffffffff) && (*piVar13 == 0 || uVar14 != 0)) &&
      (pcStack_1100 != __nptr)) && (*pcStack_1100 == '\0')) {
    return (int)uVar14;
  }
  ppcVar16 = &pcStack_1100;
  pcStack_1108 = parse_unsigned;
  __s = __nptr;
  parse_ull_cold_1();
  __nptr_00 = _optarg;
  pcStack_1110 = __nptr;
  pcStack_1138 = (char *)0x0;
  psStack_1130 = prog;
  ppcStack_1128 = &pcStack_1100;
  piStack_1120 = piVar13;
  psStack_1118 = psVar17;
  pcStack_1108 = (code *)apcStack_10d0;
  piVar13 = __errno_location();
  *piVar13 = 0;
  uVar15 = strtoul(__nptr_00,&pcStack_1138,10);
  if (((*piVar13 == 0x22 && uVar15 == 0xffffffffffffffff) || (*piVar13 != 0 && uVar15 == 0)) ||
     ((pcStack_1138 == __nptr_00 || (*pcStack_1138 != '\0')))) {
    parse_unsigned_cold_2();
    uVar15 = extraout_RAX;
  }
  else {
    if (uVar15 >> 0x20 == 0) {
      bVar4 = true;
      goto LAB_00101bc6;
    }
    parse_unsigned_cold_1();
    uVar15 = extraout_RAX_00;
  }
  bVar4 = false;
LAB_00101bc6:
  if (bVar4) {
    return (int)uVar15;
  }
  parse_unsigned_cold_3();
  fputs(__s,_stderr);
  printf("usage: %s -d <dir> [-p <pool_size>] [-e <extent_size>] [-v <val_max_factor>] [-t <timeout_seconds>] [-m <timeout_minutes>] [-o <timeout_hours>] [-s <seed_for_rand>] [-n] [-h]\n\t n  -  do not print out csv output (it is printed by default)\n"
         ,ppcVar16);
  exit(1);
LAB_00101789:
  local_40 = CONCAT44(local_40._4_4_,fVar19);
  apcStack_10d0[0] = (code *)0x101795;
  tVar9 = time((time_t *)0x0);
  if ((long)used_size <= tVar9) {
    if (p.seconds._4_4_ == 0) {
      apcStack_10d0[0] = (code *)0x1019cb;
      puts("Passed");
      iVar7 = 0;
    }
    else {
      iVar7 = 0;
      if ((local_60 & 1) == 0) {
        apcStack_10d0[0] = (code *)0x1019bd;
        printf("%zu,%.3f\n",(double)(float)local_40,uVar15 - 1);
        iVar7 = 0;
      }
    }
    goto LAB_00101a14;
  }
  apcStack_10d0[0] = (code *)0x1017b3;
  uVar8 = sprintf((char *)&p.seed,"%zu",uVar15);
  sVar6 = p.extent_size;
  sVar5 = p.pool_size;
  if ((int)uVar8 < 0) {
    apcStack_10d0[0] = (code *)0x101a0e;
    fprintf(_stderr,"sprintf return value: %d\n",(ulong)uVar8);
    goto LAB_00101a0e;
  }
  apcStack_10d0[0] = (code *)0x1017db;
  local_48 = uVar15;
  iVar7 = rand();
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar5;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = sVar6;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = SUB168(auVar3 / auVar1,0);
  apcStack_10d0[0] = (code *)0x101821;
  iVar7 = vmemcache_put(argv,&p.seed,uVar8,local_50,
                        ((ulong)(long)iVar7 /
                         (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffff)) / auVar2,0) + 1U) + 1) *
                        sVar5);
  if (iVar7 == 0) {
    apcStack_10d0[0] = (code *)0x10183f;
    iVar7 = vmemcache_get_stat(argv,7,&local_70,8);
    uVar15 = local_48;
    if (iVar7 != 0) {
      apcStack_10d0[0] = (code *)0x101956;
      main_cold_3();
      goto LAB_00101956;
    }
    uVar10 = local_10c0;
    if ((long)local_10c0 < 0) {
      uVar10 = local_10c0 >> 1;
    }
    fVar19 = (float)local_70 / (float)local_10c0;
    if (p.seconds._4_4_ != 0) {
      local_40 = CONCAT44(local_40._4_4_,fVar19);
      if (local_48 == 0) {
        local_60 = CONCAT71((int7)(uVar10 >> 8),1);
      }
      else {
        apcStack_10d0[0] = (code *)0x1018cc;
        lVar11 = lroundf(fVar19 * 100.0);
        apcStack_10d0[0] = (code *)0x1018e1;
        lVar12 = lroundf(local_54 * 100.0);
        local_60 = CONCAT71((int7)((ulong)lVar12 >> 8),lVar11 != lVar12);
      }
      fVar19 = (float)local_40;
      if ((char)local_60 != '\0') {
        apcStack_10d0[0] = (code *)0x10190c;
        printf("%zu,%.3f\n",(double)(float)local_40,uVar15);
        local_54 = (float)local_40;
        fVar19 = (float)local_40;
      }
    }
    if ((local_31 != '\x01') || (0.87 <= fVar19)) {
      bVar4 = true;
      uVar15 = uVar15 + 1;
    }
    else {
      local_40 = CONCAT44(local_40._4_4_,fVar19);
      apcStack_10d0[0] = (code *)0x101986;
      fprintf(_stderr,"insufficient space utilization. ratio: %.3f: seed %u\n",
              (ulong)(uint)p.seconds);
      bVar4 = false;
      fVar19 = (float)local_40;
    }
  }
  else {
    apcStack_10d0[0] = (code *)0x10194f;
    main_cold_2();
LAB_00101956:
    bVar4 = false;
    uVar15 = local_48;
    fVar19 = (float)local_40;
  }
  if (!bVar4) {
LAB_00101a0e:
    iVar7 = 1;
LAB_00101a14:
    apcStack_10d0[0] = (code *)0x101a1d;
    free(local_50);
LAB_00101a1d:
    apcStack_10d0[0] = (code *)0x101a25;
    vmemcache_delete(argv);
    return iVar7;
  }
  goto LAB_00101789;
switchD_00101571_caseD_76:
  apcStack_10d0[0] = (code *)0x101647;
  local_50 = (void *)parse_ull("val max factor",*argv);
  goto LAB_00101550;
}

Assistant:

int
main(int argc, char **argv)
{
	test_params p = parse_args(argc, argv);

	VMEMcache *vc = vmemcache_new();
	vmemcache_set_size(vc, p.pool_size);
	vmemcache_set_extent_size(vc, p.extent_size);
	vmemcache_set_eviction_policy(vc, VMEMCACHE_REPLACEMENT_LRU);
	if (vmemcache_add(vc, p.dir))
		UT_FATAL("vmemcache_new: %s (%s)", vmemcache_errormsg(), p.dir);

	int ret = put_until_timeout(vc, &p);

	vmemcache_delete(vc);

	return ret;
}